

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugmodes.c
# Opt level: O1

void av1_print_uncompressed_frame_header(uint8_t *data,int size,char *filename)

{
  FILE *__s;
  
  __s = fopen64(filename,"w");
  fwrite(data,(long)size,1,__s);
  fseek(__s,1,0);
  fputc(0,__s);
  fclose(__s);
  return;
}

Assistant:

void av1_print_uncompressed_frame_header(const uint8_t *data, int size,
                                         const char *filename) {
  FILE *hdrFile = fopen(filename, "w");
  fwrite(data, size, sizeof(uint8_t), hdrFile);

  // Reset order hints(7bit + a previous bit) to 0, so that all camera frame
  // headers are identical in large scale coding.
  uint8_t zero = 0;
  fseek(hdrFile, 1, SEEK_SET);
  // Reset second byte.
  fwrite(&zero, 1, sizeof(uint8_t), hdrFile);
  fclose(hdrFile);
}